

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetContentRegionMax(void)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 mx;
  ImGuiWindow *lhs;
  ImVec2 local_8;
  
  pIVar1 = GImGui;
  lhs = GImGui->CurrentWindow;
  local_8 = ::operator-((ImVec2 *)lhs,(ImVec2 *)0x32cb37);
  if (((lhs->DC).CurrentColumns != (ImGuiOldColumns *)0x0) ||
     (pIVar1->CurrentTable != (ImGuiTable *)0x0)) {
    local_8.x = (lhs->WorkRect).Max.x - (lhs->Pos).x;
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::GetContentRegionMax()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImVec2 mx = window->ContentRegionRect.Max - window->Pos;
    if (window->DC.CurrentColumns || g.CurrentTable)
        mx.x = window->WorkRect.Max.x - window->Pos.x;
    return mx;
}